

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  char *pcVar1;
  value_type local_38;
  
  ImVector<ImGuiTextFilter::TextRange>::resize(out,0);
  local_38.b = this->b;
  for (pcVar1 = local_38.b; local_38.e = pcVar1, pcVar1 < this->e; pcVar1 = pcVar1 + 1) {
    if (*pcVar1 == separator) {
      ImVector<ImGuiTextFilter::TextRange>::push_back(out,&local_38);
      local_38.b = pcVar1 + 1;
    }
  }
  if (pcVar1 != local_38.b) {
    ImVector<ImGuiTextFilter::TextRange>::push_back(out,&local_38);
  }
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}